

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall fasttext::Dictionary::save(Dictionary *this,ostream *out)

{
  pointer peVar1;
  long lVar2;
  _Hash_node_base *p_Var3;
  long lVar4;
  long lVar5;
  entry e;
  undefined8 local_80;
  long local_70 [2];
  undefined8 local_60;
  undefined1 local_58 [8];
  vector<int,_std::allocator<int>_> local_50;
  int32_t *local_38;
  
  local_38 = &this->size_;
  std::ostream::write((char *)out,(long)local_38);
  std::ostream::write((char *)out,(long)&this->nwords_);
  std::ostream::write((char *)out,(long)&this->nlabels_);
  std::ostream::write((char *)out,(long)&this->ntokens_);
  std::ostream::write((char *)out,(long)&this->pruneidx_size_);
  if (0 < this->size_) {
    lVar5 = 0x30;
    lVar4 = 0;
    do {
      peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_80 = (_Hash_node_base *)local_70;
      lVar2 = *(long *)((long)peVar1 + lVar5 + -0x30);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,lVar2,*(long *)((long)peVar1 + lVar5 + -0x28) + lVar2);
      local_58[0] = *(undefined1 *)((long)peVar1 + lVar5 + -8);
      local_60 = *(undefined8 *)((long)peVar1 + lVar5 + -0x10);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_50,
                 (vector<int,_std::allocator<int>_> *)
                 ((long)&(peVar1->word)._M_dataplus._M_p + lVar5));
      std::ostream::write((char *)out,(long)local_80);
      std::ostream::put((char)out);
      std::ostream::write((char *)out,(long)&local_60);
      std::ostream::write((char *)out,(long)local_58);
      if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_80 != (_Hash_node_base *)local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x48;
    } while (lVar4 < *local_38);
  }
  p_Var3 = (this->pruneidx_)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      local_80 = p_Var3[1]._M_nxt;
      std::ostream::write((char *)out,(long)&local_80);
      std::ostream::write((char *)out,(long)&local_80 + 4);
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void Dictionary::save(std::ostream& out) const {
  out.write((char*)&size_, sizeof(int32_t));
  out.write((char*)&nwords_, sizeof(int32_t));
  out.write((char*)&nlabels_, sizeof(int32_t));
  out.write((char*)&ntokens_, sizeof(int64_t));
  out.write((char*)&pruneidx_size_, sizeof(int64_t));
  for (int32_t i = 0; i < size_; i++) {
    entry e = words_[i];
    out.write(e.word.data(), e.word.size() * sizeof(char));
    out.put(0);
    out.write((char*)&(e.count), sizeof(int64_t));
    out.write((char*)&(e.type), sizeof(entry_type));
  }
  for (const auto pair : pruneidx_) {
    out.write((char*)&(pair.first), sizeof(int32_t));
    out.write((char*)&(pair.second), sizeof(int32_t));
  }
}